

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::selectionSort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  undefined4 uVar1;
  bool bVar2;
  CRef in_ESI;
  reduceDB_lt *in_RDI;
  uint tmp;
  int best_i;
  int j;
  int i;
  CRef local_20;
  CRef local_1c;
  CRef y;
  
  local_20 = 0;
  while (y = local_20, local_1c = local_20, (int)local_20 < (int)(in_ESI - 1)) {
    while (local_1c = local_1c + 1, (int)local_1c < (int)in_ESI) {
      bVar2 = reduceDB_lt::operator()(in_RDI,in_ESI,y);
      if (bVar2) {
        local_20 = local_1c;
      }
    }
    uVar1 = *(undefined4 *)((long)&in_RDI->ca + (long)(int)y * 4);
    *(undefined4 *)((long)&in_RDI->ca + (long)(int)y * 4) =
         *(undefined4 *)((long)&in_RDI->ca + (long)(int)local_20 * 4);
    *(undefined4 *)((long)&in_RDI->ca + (long)(int)local_20 * 4) = uVar1;
    local_20 = y + 1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}